

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface.cc
# Opt level: O2

void __thiscall
rcg::Interface::Interface
          (Interface *this,shared_ptr<rcg::System> *_parent,
          shared_ptr<const_rcg::GenTLWrapper> *_gentl,char *_id)

{
  (this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->parent).super___shared_ptr<rcg::System,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->parent).super___shared_ptr<rcg::System,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_enable_shared_from_this<rcg::Interface>)._M_weak_this.
  super___weak_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<rcg::Interface>)._M_weak_this.
  super___weak_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->id)._M_dataplus._M_p = (pointer)&(this->id).field_2;
  (this->id)._M_string_length = 0;
  (this->id).field_2._M_local_buf[0] = '\0';
  (this->mtx).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  (this->mtx).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mtx).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->mtx).super___mutex_base._M_mutex + 0x10) = 0;
  (this->mtx).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->cport).super___shared_ptr<rcg::CPort,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->cport).super___shared_ptr<rcg::CPort,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->nodemap).super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->nodemap).super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->dlist).
  super__Vector_base<std::weak_ptr<rcg::Device>,_std::allocator<std::weak_ptr<rcg::Device>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->dlist).
  super__Vector_base<std::weak_ptr<rcg::Device>,_std::allocator<std::weak_ptr<rcg::Device>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->dlist).
  super__Vector_base<std::weak_ptr<rcg::Device>,_std::allocator<std::weak_ptr<rcg::Device>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__shared_ptr<rcg::System,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->parent).super___shared_ptr<rcg::System,_(__gnu_cxx::_Lock_policy)2>,
             &_parent->super___shared_ptr<rcg::System,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>,
             &_gentl->super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>);
  std::__cxx11::string::assign((char *)&this->id);
  this->n_open = 0;
  this->ifh = (void *)0x0;
  return;
}

Assistant:

Interface::Interface(const std::shared_ptr<System> &_parent,
                     const std::shared_ptr<const GenTLWrapper> &_gentl, const char *_id)
{
  parent=_parent;
  gentl=_gentl;
  id=_id;

  n_open=0;
  ifh=0;
}